

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O2

int i4_partition_distinct_count(int n)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 *puVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  
  uVar9 = 0xffffffffffffffff;
  if (-2 < n) {
    uVar9 = (ulong)(n + 1) << 2;
  }
  puVar5 = (undefined4 *)operator_new__(uVar9);
  iVar3 = 0;
  if (0 < n) {
    iVar3 = n;
  }
  *puVar5 = 1;
  uVar9 = 1;
  for (uVar11 = uVar9; uVar11 != iVar3 + 1; uVar11 = uVar11 + 1) {
    bVar2 = i4_is_triangular((int)uVar11);
    uVar4 = (uint)bVar2;
    lVar7 = 4;
    uVar6 = uVar9;
    iVar1 = 1;
    iVar8 = -1;
    while( true ) {
      iVar10 = iVar1;
      puVar5[uVar11] = uVar4;
      if (uVar11 < (lVar7 * uVar6 & 0xffffffff)) break;
      uVar4 = uVar4 + puVar5[uVar11 - lVar7 * uVar6] * iVar10;
      lVar7 = lVar7 + 3;
      uVar6 = uVar6 + 1;
      iVar1 = iVar8;
      iVar8 = iVar10;
    }
    uVar6 = uVar9;
    iVar1 = 1;
    iVar8 = -1;
    for (lVar7 = 2; iVar10 = iVar1, (long)(lVar7 * uVar6) <= (long)uVar11; lVar7 = lVar7 + 3) {
      uVar4 = uVar4 + puVar5[uVar11 - lVar7 * uVar6] * iVar10;
      puVar5[uVar11] = uVar4;
      uVar6 = uVar6 + 1;
      iVar1 = iVar8;
      iVar8 = iVar10;
    }
  }
  iVar3 = puVar5[n];
  operator_delete__(puVar5);
  return iVar3;
}

Assistant:

int i4_partition_distinct_count ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    I4_PARTITION_DISTINCT_COUNT returns any value of Q(N).
//
//  Discussion:
//
//    A partition of an integer N is a representation of the integer
//    as the sum of nonzero positive integers.  The order of the summands
//    does not matter.  The number of partitions of N is symbolized
//    by P(N).  Thus, the number 5 has P(N) = 7, because it has the
//    following partitions:
//
//    5 = 5
//      = 4 + 1
//      = 3 + 2
//      = 3 + 1 + 1
//      = 2 + 2 + 1
//      = 2 + 1 + 1 + 1
//      = 1 + 1 + 1 + 1 + 1
//
//    However, if we require that each member of the partition
//    be distinct, we are computing something symbolized by Q(N).
//    The number 5 has Q(N) = 3, because it has the following partitions
//    into distinct parts:
//
//    5 = 5
//      = 4 + 1
//      = 3 + 2
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    22 February 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the integer to be partitioned.
//
//    Output, int I4_PARTITION_DISTINCT_COUNT, the number of partitions 
//    of the integer into distinct parts.
//
{
  int *c;
  int i;
  int k;
  int k2;
  int k_sign;
  int value;

  c = new int[n+1];

  c[0] = 1;

  for ( i = 1; i <= n; i++ )
  {
    if ( i4_is_triangular ( i ) )
    {
      c[i] = 1;
    }
    else
    {
      c[i] = 0;
    }

    k = 0;
    k_sign = -1;

    for ( ; ; )
    {
      k = k + 1;
      k_sign = -k_sign;
      k2 = k * ( 3 * k + 1 );

      if ( i < k2 )
      {
        break;
      }

      c[i] = c[i] + k_sign * c[i-k2];

    }

    k = 0;
    k_sign = -1;

    for ( ; ; )
    {
      k = k + 1;
      k_sign = -k_sign;
      k2 = k * ( 3 * k - 1 );

      if ( i < k2 )
      {
        break;
      }

      c[i] = c[i] + k_sign * c[i-k2];

    }

  }

  value = c[n];

  delete [] c;

  return value;
}